

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_TAGGED_PROPERTY_Unmarshal(TPMS_TAGGED_PROPERTY *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->property = UVar2;
    *buffer = *buffer + 4;
    iVar1 = *size;
    *size = iVar1 + -4;
    TVar3 = 0x9a;
    if (3 < iVar1) {
      UVar2 = ByteArrayToUint32(*buffer);
      target->value = UVar2;
      *buffer = *buffer + 4;
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_TAGGED_PROPERTY_Unmarshal(TPMS_TAGGED_PROPERTY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_PT_Unmarshal((TPM_PT *)&(target->property), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->value), buffer, size);
    return result;
}